

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void __thiscall
duckdb::ModeFunction<duckdb::ModeStandard<float>_>::
UpdateWindowState<duckdb::ModeState<float,_duckdb::ModeStandard<float>_>,_float>::Left
          (UpdateWindowState<duckdb::ModeState<float,_duckdb::ModeStandard<float>_>,_float> *this,
          idx_t begin,idx_t end)

{
  DataChunk *result;
  unsigned_long *puVar1;
  ModeState<float,_duckdb::ModeStandard<float>_> *pMVar2;
  ColumnDataScanState *state;
  reference pvVar3;
  ulong uVar4;
  
  if (begin < end) {
    do {
      puVar1 = (this->included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[begin >> 6] >> (begin & 0x3f) & 1) != 0)) {
        pMVar2 = this->included->state;
        state = pMVar2->scan;
        if ((state->next_row_index <= begin) || (begin < state->current_row_index)) {
          result = &pMVar2->page;
          ColumnDataCollection::Seek(pMVar2->inputs,begin,state,result);
          pvVar3 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
          pMVar2->data = (float *)pvVar3->data;
          pvVar3 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
          FlatVector::VerifyFlatVector(pvVar3);
          pMVar2->validity = &pvVar3->validity;
        }
        puVar1 = (pMVar2->validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar1 == (unsigned_long *)0x0) ||
           (uVar4 = begin - pMVar2->scan->current_row_index,
           (puVar1[uVar4 >> 6 & 0x3ffffff] >> (uVar4 & 0x3f) & 1) != 0)) {
          ModeState<float,_duckdb::ModeStandard<float>_>::ModeRm(this->state,begin);
        }
      }
      begin = begin + 1;
    } while (end != begin);
  }
  return;
}

Assistant:

inline void Left(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					state.ModeRm(begin);
				}
			}
		}